

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O1

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_30;
  ssize_t local_20;
  uv_close_cb local_18;
  
  local_20 = 0;
  local_18 = (uv_close_cb)nread;
  if (nread < 1) {
    pcStack_30 = (code *)0x1df1c5;
    sv_recv_cb_cold_1();
LAB_001df1c5:
    pcStack_30 = (code *)0x1df1d4;
    sv_recv_cb_cold_2();
LAB_001df1d4:
    pcStack_30 = (code *)0x1df1d9;
    sv_recv_cb_cold_4();
  }
  else {
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_001df1e8;
    }
    local_18 = (uv_close_cb)0x4;
    local_20 = nread;
    if (nread != 4) goto LAB_001df1c5;
    if (addr == (sockaddr *)0x0) goto LAB_001df1d4;
    pcStack_30 = (code *)0x1df164;
    iVar1 = memcmp("EXIT",rcvbuf->base,4);
    local_18 = (uv_close_cb)(long)iVar1;
    local_20 = 0;
    if (local_18 == (uv_close_cb)0x0) {
      pcStack_30 = (code *)0x1df192;
      uv_close((uv_handle_t *)handle,close_cb);
      pcStack_30 = (code *)0x1df1a1;
      uv_close((uv_handle_t *)&client,close_cb);
      sv_recv_cb_called = sv_recv_cb_called + 1;
      return;
    }
  }
  pcStack_30 = (code *)0x1df1e8;
  sv_recv_cb_cold_3();
LAB_001df1e8:
  pcStack_30 = close_cb;
  sv_recv_cb_cold_5();
  pcStack_30 = (code *)(ulong)((uv_udp_t *)addr == &client || (uv_udp_t *)addr == &server);
  if (pcStack_30 == (code *)0x0) {
    addr = (sockaddr *)&stack0xffffffffffffffd0;
    close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_closing((uv_handle_t *)addr);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)addr);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)addr,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  if (nread > 0) {
    ASSERT_EQ(4, nread);
    ASSERT_NOT_NULL(addr);
    ASSERT_OK(memcmp("EXIT", rcvbuf->base, nread));
    if (++sv_recv_cb_called == 4) {
      uv_close((uv_handle_t*) &server, close_cb);
      uv_close((uv_handle_t*) &client, close_cb);
    }
  }
}